

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_MappingChannel> *a)

{
  bool bVar1;
  bool bVar2;
  ON_MappingChannel *this_00;
  int iVar3;
  int count;
  int local_1c;
  
  if (a->m_a != (ON_MappingChannel *)0x0) {
    memset(a->m_a,0,(long)a->m_capacity * 0x98);
  }
  a->m_count = 0;
  bVar1 = ReadInt(this,&local_1c);
  iVar3 = 0;
  bVar2 = false;
  if (bVar1) {
    ON_SimpleArray<ON_MappingChannel>::SetCapacity(a,(long)local_1c);
    bVar2 = true;
    while ((iVar3 < local_1c && (bVar2 != false))) {
      this_00 = ON_SimpleArray<ON_MappingChannel>::AppendNew(a);
      bVar2 = ON_MappingChannel::Read(this_00,this);
      iVar3 = iVar3 + 1;
    }
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_SimpleArray<ON_MappingChannel>& a )
{
  a.Empty();
  int i, count;
  bool rc = ReadInt( &count );
  if (rc)
  {
    a.SetCapacity(count);
    for  ( i = 0; i < count && rc; i++ )
    {
      rc = a.AppendNew().Read(*this);
    }
  }
  return rc;
}